

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstack.cpp
# Opt level: O2

void __thiscall CVmStack::CVmStack(CVmStack *this,size_t max_depth,size_t reserve)

{
  sp_ = (vm_val_t *)malloc((reserve + max_depth) * 0x10 + 400);
  this->arr_ = sp_;
  this->max_depth_ = max_depth;
  this->reserve_depth_ = reserve;
  this->reserve_in_use_ = 0;
  return;
}

Assistant:

CVmStack::CVmStack(size_t max_depth, size_t reserve)
{
    /* 
     *   Allocate the array of stack elements.  Allocate the requested
     *   maximum depth plus the requested reserve space.  Overallocate by a
     *   few elements to leave ourselves a little buffer against mild
     *   overages - for the most part, we count on the compiler to check for
     *   proper stack usage at entry to each function, but intrinsics
     *   sometimes push a few elements without checking.  
     */
    arr_ = (vm_val_t *)t3malloc((max_depth + reserve + 25) * sizeof(arr_[0]));
    
    /* remember the maximum depth and the reserve depth */
    max_depth_ = max_depth;
    reserve_depth_ = reserve;

    /* the reserve is not yet in use */
    reserve_in_use_ = FALSE;

    /* initialize the stack pointer */
    init();
}